

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::cose::Sign1Message::Init
          (Error *__return_storage_ptr__,Sign1Message *this,int aCoseInitFlags)

{
  HCOSE_SIGN0 p_Var1;
  char *pcVar2;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string local_78;
  format_string_checker<char> local_58;
  
  p_Var1 = COSE_Sign0_Init(aCoseInitFlags,(cose_errback *)0x0);
  this->mSign = p_Var1;
  if (p_Var1 == (HCOSE_SIGN0)0x0) {
    local_58.types_[0] = none_type;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "create COSE SIGN1 message";
    local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x19;
    local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_58.parse_funcs_[0] = (parse_func)0x0;
    begin = "create COSE SIGN1 message";
    local_58.context_.types_ = local_58.types_;
    do {
      pcVar2 = begin + 1;
      if (*begin == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar2 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",&local_58);
      }
      begin = pcVar2;
    } while (pcVar2 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    fmt::v10::vformat_abi_cxx11_
              (&local_78,(v10 *)"create COSE SIGN1 message",(string_view)ZEXT816(0x19),args);
    __return_storage_ptr__->mCode = kOutOfMemory;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->mMessage,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
  }
  else {
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  }
  if ((p_Var1 == (HCOSE_SIGN0)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2)) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::Init(int aCoseInitFlags)
{
    mSign = COSE_Sign0_Init(static_cast<COSE_INIT_FLAGS>(aCoseInitFlags), nullptr);
    return mSign ? ERROR_NONE : ERROR_OUT_OF_MEMORY("create COSE SIGN1 message");
}